

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

void Abc_NtkDontCareSimulateSetElem(Odc_Man_t *p)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  
  if (0 < p->nVarsMax) {
    lVar4 = 0;
    do {
      if (p->nPis <= lVar4) {
        __assert_fail("i >= 0 && i < p->nPis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                      ,0x72,"Odc_Lit_t Odc_Var(Odc_Man_t *, int)");
      }
      lVar1 = lVar4 + 1;
      if ((p->vTruths->nSize <= (int)((uint)lVar1 & 0x7fff)) || (p->vTruthsElem->nSize <= lVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (0 < (long)p->nWords) {
        pvVar2 = p->vTruths->pArray[(uint)lVar1 & 0x7fff];
        pvVar3 = p->vTruthsElem->pArray[lVar4];
        lVar4 = (long)p->nWords + 1;
        do {
          *(undefined4 *)((long)pvVar2 + lVar4 * 4 + -8) =
               *(undefined4 *)((long)pvVar3 + lVar4 * 4 + -8);
          lVar4 = lVar4 + -1;
        } while (1 < lVar4);
      }
      lVar4 = lVar1;
    } while (lVar1 < p->nVarsMax);
  }
  return;
}

Assistant:

void Abc_NtkDontCareSimulateSetElem( Odc_Man_t * p )
{
    unsigned * pData, * pData2;
    int k;
    for ( k = 0; k < p->nVarsMax; k++ )
    {
        pData = Odc_ObjTruth( p, Odc_Var(p, k) );
        pData2 = (unsigned *)Vec_PtrEntry( p->vTruthsElem, k );
        Abc_InfoCopy( pData, pData2, p->nWords );
    }
}